

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

TimeZoneFormat * __thiscall
icu_63::TimeZoneFormat::operator=(TimeZoneFormat *this,TimeZoneFormat *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_28;
  UErrorCode local_24;
  int32_t i;
  UErrorCode status;
  TimeZoneFormat *other_local;
  TimeZoneFormat *this_local;
  
  if (this != other) {
    _i = other;
    other_local = this;
    if (this->fTimeZoneNames != (TimeZoneNames *)0x0) {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[1])();
    }
    if (this->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
      (*this->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[1])();
    }
    this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
    if (this->fTZDBTimeZoneNames != (TZDBTimeZoneNames *)0x0) {
      (*(this->fTZDBTimeZoneNames->super_TimeZoneNames).super_UObject._vptr_UObject[1])();
    }
    this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
    Locale::operator=(&this->fLocale,&_i->fLocale);
    *(undefined4 *)this->fTargetRegion = *(undefined4 *)_i->fTargetRegion;
    iVar1 = (*(_i->fTimeZoneNames->super_UObject)._vptr_UObject[4])();
    this->fTimeZoneNames = (TimeZoneNames *)CONCAT44(extraout_var,iVar1);
    if (_i->fTimeZoneGenericNames != (TimeZoneGenericNames *)0x0) {
      iVar1 = (*_i->fTimeZoneGenericNames->_vptr_TimeZoneGenericNames[4])();
      this->fTimeZoneGenericNames = (TimeZoneGenericNames *)CONCAT44(extraout_var_00,iVar1);
    }
    UnicodeString::operator=(&this->fGMTPattern,&_i->fGMTPattern);
    UnicodeString::operator=(&this->fGMTPatternPrefix,&_i->fGMTPatternPrefix);
    UnicodeString::operator=(&this->fGMTPatternSuffix,&_i->fGMTPatternSuffix);
    local_24 = U_ZERO_ERROR;
    for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
      UnicodeString::operator=
                ((UnicodeString *)(this->fTargetRegion + (long)local_28 * 0x40 + 0x58),
                 (UnicodeString *)(_i->fTargetRegion + (long)local_28 * 0x40 + 0x58));
      if (this->fGMTOffsetPatternItems[local_28] != (UVector *)0x0) {
        (*(this->fGMTOffsetPatternItems[local_28]->super_UObject)._vptr_UObject[1])();
      }
      this->fGMTOffsetPatternItems[local_28] = (UVector *)0x0;
    }
    initGMTOffsetPatterns(this,&local_24);
    UnicodeString::operator=(&this->fGMTZeroFormat,&_i->fGMTZeroFormat);
    memcpy(this->fGMTOffsetDigits,_i->fGMTOffsetDigits,0x28);
    this->fDefParseOptionFlags = _i->fDefParseOptionFlags;
  }
  return this;
}

Assistant:

TimeZoneFormat&
TimeZoneFormat::operator=(const TimeZoneFormat& other) {
    if (this == &other) {
        return *this;
    }

    delete fTimeZoneNames;
    delete fTimeZoneGenericNames;
    fTimeZoneGenericNames = NULL;
    delete fTZDBTimeZoneNames;
    fTZDBTimeZoneNames = NULL;

    fLocale = other.fLocale;
    uprv_memcpy(fTargetRegion, other.fTargetRegion, sizeof(fTargetRegion));

    fTimeZoneNames = other.fTimeZoneNames->clone();
    if (other.fTimeZoneGenericNames) {
        // TODO: this test has dubious thread safety.
        fTimeZoneGenericNames = other.fTimeZoneGenericNames->clone();
    }

    fGMTPattern = other.fGMTPattern;
    fGMTPatternPrefix = other.fGMTPatternPrefix;
    fGMTPatternSuffix = other.fGMTPatternSuffix;

    UErrorCode status = U_ZERO_ERROR;
    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatterns[i] = other.fGMTOffsetPatterns[i];
        delete fGMTOffsetPatternItems[i];
        fGMTOffsetPatternItems[i] = NULL;
    }
    initGMTOffsetPatterns(status);
    U_ASSERT(U_SUCCESS(status));

    fGMTZeroFormat = other.fGMTZeroFormat;

    uprv_memcpy(fGMTOffsetDigits, other.fGMTOffsetDigits, sizeof(fGMTOffsetDigits));

    fDefParseOptionFlags = other.fDefParseOptionFlags;

    return *this;
}